

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

bool loguru::remove_callback(char *id)

{
  close_handler_t p_Var1;
  bool bVar2;
  Verbosity VVar3;
  pointer pCVar4;
  double __x;
  const_iterator local_60;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  local_58;
  char **local_50;
  Callback *local_48;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  local_30;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  local_28;
  __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  char *id_local;
  
  lock._M_device = (mutex_type *)id;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&it,(mutex_type *)s_mutex);
  local_30._M_current =
       (Callback *)
       std::begin<std::vector<loguru::Callback,std::allocator<loguru::Callback>>>
                 ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  local_48 = (Callback *)
             std::end<std::vector<loguru::Callback,std::allocator<loguru::Callback>>>
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  local_50 = (char **)&lock;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<loguru::Callback*,std::vector<loguru::Callback,std::allocator<loguru::Callback>>>,loguru::remove_callback(char_const*)::__0>
                       (local_30,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                  )local_48,(anon_class_8_1_3fcf65d9_for__M_pred)local_50);
  local_58._M_current =
       (Callback *)
       std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                 ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_58);
  if (bVar2) {
    pCVar4 = __gnu_cxx::
             __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
             ::operator->(&local_28);
    if (pCVar4->close != (close_handler_t)0x0) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
               ::operator->(&local_28);
      p_Var1 = pCVar4->close;
      pCVar4 = __gnu_cxx::
               __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
               ::operator->(&local_28);
      (*p_Var1)(pCVar4->user_data);
    }
    __gnu_cxx::
    __normal_iterator<loguru::Callback_const*,std::vector<loguru::Callback,std::allocator<loguru::Callback>>>
    ::__normal_iterator<loguru::Callback*>
              ((__normal_iterator<loguru::Callback_const*,std::vector<loguru::Callback,std::allocator<loguru::Callback>>>
                *)&local_60,&local_28);
    std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::erase
              ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks,local_60);
    on_callback_change();
    id_local._7_1_ = true;
  }
  else {
    VVar3 = current_verbosity_cutoff();
    if (-3 < VVar3) {
      log(__x);
    }
    id_local._7_1_ = false;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&it);
  return id_local._7_1_;
}

Assistant:

bool remove_callback(const char* id)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		auto it = std::find_if(begin(s_callbacks), end(s_callbacks), [&](const Callback& c) { return c.id == id; });
		if (it != s_callbacks.end()) {
			if (it->close) { it->close(it->user_data); }
			s_callbacks.erase(it);
			on_callback_change();
			return true;
		} else {
			LOG_F(ERROR, "Failed to locate callback with id '%s'", id);
			return false;
		}
	}